

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O3

uint32_t read_vbyte(FILE *f)

{
  uint uVar1;
  ulong in_RAX;
  size_t sVar2;
  uint32_t uVar3;
  uint uVar4;
  uint8_t chr;
  undefined8 uStack_28;
  
  uVar3 = 0;
  uVar4 = 0;
  uStack_28 = in_RAX & 0xffffffffffffff;
  do {
    sVar2 = fread((void *)((long)&uStack_28 + 7),1,1,(FILE *)f);
    if ((int)sVar2 != 1) {
      quit("reading vbyte from file: %d != %d",sVar2 & 0xffffffff,1);
    }
    uVar1 = uVar4 & 0x1f;
    uVar4 = uVar4 + 7;
    uVar3 = uVar3 + ((uStack_28._7_1_ & 0x7f) << uVar1);
  } while ((long)uStack_28 < 0);
  return uVar3;
}

Assistant:

uint32_t read_vbyte(FILE* f)
{
    uint32_t x = 0;
    unsigned int shift = 0;
    uint8_t chr = 0;
    while (true) {
        int ret = fread(&chr, 1, 1, f);
        if (ret != 1) {
            quit("reading vbyte from file: %d != %d", ret, 1);
        }
        x += ((chr & 127) << shift);
        if (!(chr & 128)) {
            return x;
        }
        shift += 7;
    }
}